

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_utils.h
# Opt level: O0

void __thiscall
ktx::OptionsDeflate::process
          (OptionsDeflate *this,Options *param_2,ParseResult *args,Reporter *report)

{
  __optional_lt_t<unsigned_int,_unsigned_int> _Var1;
  bool bVar2;
  uint uVar3;
  OptionValue *pOVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  size_t sVar5;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  long in_RDI;
  uint *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  __optional_gt_t<unsigned_int,_unsigned_int> _Var6;
  string *in_stack_ffffffffffffff18;
  string *option;
  ParseResult *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  char (*args_00) [68];
  Reporter *this_01;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 uStack_90;
  undefined1 local_89 [33];
  undefined4 local_68;
  undefined4 local_64;
  uint local_60;
  undefined4 local_5c;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  ParseResult *in_stack_ffffffffffffffb0;
  OptionsDeflate *in_stack_ffffffffffffffb8;
  string local_40 [32];
  ParseResult *local_20;
  
  local_20 = (ParseResult *)CONCAT71(in_register_00000009,in_CL);
  this_01 = (Reporter *)&stack0xffffffffffffffbf;
  args_00 = (char (*) [68])kZStd;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,
             (char *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
             (allocator<char> *)in_stack_ffffffffffffff20);
  pOVar4 = cxxopts::ParseResult::operator[](in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            cxxopts::OptionValue::count(pOVar4);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbf);
  if (this_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    local_60 = captureCompressOption<unsigned_int>
                         (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                          (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    std::optional<unsigned_int>::optional<unsigned_int,_true>
              ((optional<unsigned_int> *)
               CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffee8);
    *(ulong *)(in_RDI + 0x20) = CONCAT44(in_stack_ffffffffffffffa8,local_5c);
    local_64 = 1;
    _Var1 = std::enable_if<is_convertible<decltype(((std::declval<unsigned_int_const&>)())<((std::
            declval<unsigned_int_const&>)())),bool>::value,bool>::type_std::operator<
                      ((optional<unsigned_int> *)
                       CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                       in_stack_fffffffffffffee8);
    in_stack_ffffffffffffff2f = true;
    if (!_Var1) {
      local_68 = 0x16;
      in_stack_ffffffffffffff2f =
           std::operator>((optional<unsigned_int> *)
                          CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                          in_stack_fffffffffffffee8);
    }
    if ((__optional_gt_t<unsigned_int,_unsigned_int>)in_stack_ffffffffffffff2f != false) {
      std::optional<unsigned_int>::value
                ((optional<unsigned_int> *)
                 CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
      Reporter::fatal_usage<char_const(&)[68],unsigned_int&>
                ((Reporter *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 (char (*) [68])CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 (uint *)this_01);
      in_stack_ffffffffffffff20 = local_20;
    }
  }
  option = (string *)local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
             (allocator<char> *)in_stack_ffffffffffffff20);
  pOVar4 = cxxopts::ParseResult::operator[](in_stack_ffffffffffffff20,option);
  sVar5 = cxxopts::OptionValue::count(pOVar4);
  std::__cxx11::string::~string((string *)(local_89 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_89);
  if (sVar5 != 0) {
    uVar3 = captureCompressOption<unsigned_int>
                      (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                       (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    std::optional<unsigned_int>::optional<unsigned_int,_true>
              ((optional<unsigned_int> *)
               CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffee8);
    *(ulong *)(in_RDI + 0x28) = CONCAT44(uStack_90,in_stack_ffffffffffffff6c);
    uVar7 = 1;
    _Var1 = std::enable_if<is_convertible<decltype(((std::declval<unsigned_int_const&>)())<((std::
            declval<unsigned_int_const&>)())),bool>::value,bool>::type_std::operator<
                      ((optional<unsigned_int> *)
                       CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                       in_stack_fffffffffffffee8);
    _Var6 = true;
    if (!_Var1) {
      in_stack_ffffffffffffff60 = 9;
      _Var6 = std::operator>((optional<unsigned_int> *)CONCAT17(1,in_stack_fffffffffffffef0),
                             in_stack_fffffffffffffee8);
    }
    if (_Var6 != false) {
      std::optional<unsigned_int>::value
                ((optional<unsigned_int> *)CONCAT17(_Var6,in_stack_fffffffffffffef0));
      Reporter::fatal_usage<char_const(&)[67],unsigned_int&>
                ((Reporter *)CONCAT44(in_stack_ffffffffffffff6c,uVar3),
                 (char (*) [67])CONCAT44(uVar7,in_stack_ffffffffffffff60),(uint *)this_01);
    }
  }
  bVar2 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x21774f);
  if ((bVar2) &&
     (bVar2 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x217763), bVar2)) {
    Reporter::fatal_usage<char_const(&)[68]>(this_01,args_00);
  }
  return;
}

Assistant:

void process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter& report) {
        if (args[kZStd].count()) {
            zstd = captureCompressOption<uint32_t>(args, kZStd);
            if (zstd < 1u || zstd > 22u)
                report.fatal_usage("Invalid zstd level: \"{}\". Value must be between 1 and 22 inclusive.", zstd.value());
        }
        if (args[kZLib].count()) {
            zlib = captureCompressOption<uint32_t>(args, kZLib);
            if (zlib < 1u || zlib > 9u)
                report.fatal_usage("Invalid zlib level: \"{}\". Value must be between 1 and 9 inclusive.", zlib.value());
        }
        if (zstd.has_value() && zlib.has_value())
            report.fatal_usage("Conflicting options: zstd and zlib cannot be used at the same time.");
    }